

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::Equals,false,false,true,true>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  bool bVar5;
  idx_t iVar6;
  sel_t sVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  
  if (count + 0x3f < 0x40) {
    iVar6 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar6 = 0;
    lVar9 = 0;
    uVar13 = 0;
    uVar14 = 0;
    do {
      uVar10 = uVar13;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar15 = uVar13 + 0x40;
        if (count <= uVar13 + 0x40) {
          uVar15 = count;
        }
LAB_003f7ea0:
        if (uVar13 < uVar15) {
          psVar2 = sel->sel_vector;
          psVar3 = true_sel->sel_vector;
          psVar4 = false_sel->sel_vector;
          uVar12 = uVar13 << 4 | 8;
          do {
            uVar10 = uVar13;
            if (psVar2 != (sel_t *)0x0) {
              uVar10 = (ulong)psVar2[uVar13];
            }
            bVar16 = *(long *)((long)&ldata->lower + uVar12) ==
                     *(long *)((long)&rdata->lower + uVar12);
            bVar5 = *(long *)((long)ldata + (uVar12 - 8)) == *(long *)((long)rdata + (uVar12 - 8));
            psVar3[iVar6] = (sel_t)uVar10;
            iVar6 = iVar6 + (bVar16 && bVar5);
            psVar4[lVar9] = (sel_t)uVar10;
            lVar9 = lVar9 + (ulong)(!bVar16 || !bVar5);
            uVar13 = uVar13 + 1;
            uVar12 = uVar12 + 0x10;
            uVar10 = uVar15;
          } while (uVar15 != uVar13);
        }
      }
      else {
        uVar12 = puVar1[uVar14];
        uVar15 = uVar13 + 0x40;
        if (count <= uVar13 + 0x40) {
          uVar15 = count;
        }
        if (uVar12 == 0xffffffffffffffff) goto LAB_003f7ea0;
        if (uVar12 == 0) {
          uVar10 = uVar15;
          if (uVar13 < uVar15) {
            psVar2 = sel->sel_vector;
            psVar3 = false_sel->sel_vector;
            do {
              uVar10 = uVar13;
              if (psVar2 != (sel_t *)0x0) {
                uVar10 = (ulong)psVar2[uVar13];
              }
              psVar3[lVar9] = (sel_t)uVar10;
              lVar9 = lVar9 + 1;
              uVar13 = uVar13 + 1;
              uVar10 = uVar15;
            } while (uVar15 != uVar13);
          }
        }
        else if (uVar13 < uVar15) {
          psVar2 = sel->sel_vector;
          psVar3 = true_sel->sel_vector;
          psVar4 = false_sel->sel_vector;
          uVar8 = uVar13 << 4 | 8;
          uVar11 = 0;
          do {
            if (psVar2 == (sel_t *)0x0) {
              sVar7 = (int)uVar13 + (int)uVar11;
            }
            else {
              sVar7 = psVar2[uVar13 + uVar11];
            }
            if ((uVar12 >> (uVar11 & 0x3f) & 1) == 0) {
              bVar16 = false;
            }
            else {
              bVar16 = *(long *)((long)&ldata->lower + uVar8) ==
                       *(long *)((long)&rdata->lower + uVar8) &&
                       *(long *)((long)ldata + (uVar8 - 8)) == *(long *)((long)rdata + (uVar8 - 8));
            }
            psVar3[iVar6] = sVar7;
            iVar6 = iVar6 + bVar16;
            psVar4[lVar9] = sVar7;
            lVar9 = lVar9 + (ulong)(bVar16 ^ 1);
            uVar11 = uVar11 + 1;
            uVar8 = uVar8 + 0x10;
            uVar10 = uVar15;
          } while (uVar15 - uVar13 != uVar11);
        }
      }
      uVar13 = uVar10;
      uVar14 = uVar14 + 1;
    } while (uVar14 != count + 0x3f >> 6);
  }
  return iVar6;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}